

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O1

Hsh_IntMan_t * Sdm_ManBuildHashTable(Vec_Int_t **pvConfgRes)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *__ptr;
  Vec_Int_t *__ptr_00;
  int *piVar7;
  FILE *__stream;
  Vec_Int_t *pVVar8;
  Hsh_IntMan_t *p;
  Vec_Int_t *pVVar9;
  Vec_Wrd_t *p_00;
  word *pwVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  size_t __n;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  
  iVar4 = Extra_FileSize("dsdfuncs6.dat");
  iVar2 = iVar4 >> 0x1f;
  iVar11 = iVar4 / 0xc + iVar2;
  uVar14 = iVar11 - iVar2;
  uVar13 = (iVar11 - iVar2) - 1;
  uVar16 = 0x10;
  if (0xe < uVar13) {
    uVar16 = uVar14;
  }
  lVar17 = (long)(int)uVar16;
  if (uVar16 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc(lVar17 * 8);
  }
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nSize = 0;
  __ptr_00->nCap = uVar16;
  if (uVar16 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar17 * 4);
  }
  __ptr_00->pArray = piVar7;
  __stream = fopen("dsdfuncs6.dat","rb");
  __n = (size_t)(int)uVar14;
  fread(__ptr,8,__n,__stream);
  fread(__ptr_00->pArray,4,__n,__stream);
  __ptr_00->nSize = uVar14;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < uVar14 * 2 - 1) {
    iVar11 = uVar14 * 2;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar11;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar8->pArray = piVar7;
  memcpy(piVar7,__ptr,__n << 3);
  pVVar8->nSize = uVar14 * 2;
  p = (Hsh_IntMan_t *)calloc(1,0x20);
  p->nSize = 2;
  p->vData = pVVar8;
  while( true ) {
    do {
      uVar6 = uVar13;
      uVar13 = uVar6 + 1;
    } while ((uVar6 & 1) != 0);
    if (uVar13 < 9) break;
    iVar11 = 5;
    while (uVar13 % (iVar11 - 2U) != 0) {
      uVar5 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar13 < uVar5) goto LAB_004828d5;
    }
  }
LAB_004828d5:
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar6) {
    uVar5 = uVar13;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = uVar5;
  piVar7 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar9->pArray = piVar7;
  pVVar9->nSize = uVar13;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar13 << 2);
  }
  p->vTable = pVVar9;
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = uVar16;
  if (uVar16 == 0) {
    pwVar10 = (word *)0x0;
  }
  else {
    pwVar10 = (word *)malloc(lVar17 << 3);
  }
  p_00->pArray = pwVar10;
  p->vObjs = p_00;
  if (0xb < iVar4) {
    uVar15 = 0;
    do {
      if (pVVar9->nSize < p_00->nSize) {
        uVar18 = (ulong)(pVVar9->nSize * 2 - 1);
        while( true ) {
          do {
            uVar13 = (uint)uVar18;
            uVar16 = uVar13 + 1;
            uVar19 = (ulong)uVar16;
            uVar1 = uVar18 & 1;
            uVar18 = uVar19;
          } while (uVar1 != 0);
          if (uVar16 < 9) break;
          iVar11 = 5;
          while (uVar16 % (iVar11 - 2U) != 0) {
            uVar6 = iVar11 * iVar11;
            iVar11 = iVar11 + 2;
            if (uVar16 < uVar6) goto LAB_004829c2;
          }
        }
LAB_004829c2:
        if (pVVar9->nCap < (int)uVar16) {
          if (pVVar9->pArray == (int *)0x0) {
            piVar7 = (int *)malloc((long)(int)uVar16 << 2);
          }
          else {
            piVar7 = (int *)realloc(pVVar9->pArray,(long)(int)uVar16 << 2);
          }
          pVVar9->pArray = piVar7;
          if (piVar7 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar9->nCap = uVar16;
        }
        if (uVar13 < 0x7fffffff) {
          memset(pVVar9->pArray,0xff,uVar19 << 2);
        }
        pVVar9->nSize = uVar16;
        if (0 < p_00->nSize) {
          pwVar10 = p_00->pArray;
          lVar17 = 0;
          do {
            iVar11 = (int)pwVar10[lVar17];
            if ((iVar11 < 0) || (uVar13 = iVar11 * 2, pVVar8->nSize <= (int)uVar13))
            goto LAB_00482b98;
            lVar12 = 0;
            uVar16 = 0;
            do {
              lVar3 = lVar12 + (ulong)uVar13 * 4;
              lVar12 = lVar12 + 1;
              uVar16 = (*(byte *)((long)pVVar8->pArray + lVar3) + uVar16) * 0x401;
              uVar16 = uVar16 >> 6 ^ uVar16;
            } while (lVar12 != 8);
            uVar18 = (ulong)((uVar16 * 9 >> 0xb ^ uVar16 * 9) * 0x8001) % (ulong)(uint)pVVar9->nSize
            ;
            if (((int)uVar18 < 0) || (pVVar9->nSize <= (int)uVar18)) goto LAB_00482b98;
            piVar7 = pVVar9->pArray;
            *(int *)((long)pwVar10 + lVar17 * 8 + 4) = piVar7[uVar18];
            piVar7[uVar18] = (int)lVar17;
            lVar17 = lVar17 + 1;
          } while (lVar17 < p_00->nSize);
        }
      }
      if (pVVar8->nSize <= (int)uVar15 * 2) {
LAB_00482b98:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar7 = Hsh_IntManLookup(p,(uint *)(pVVar8->pArray + uVar15 * 2));
      iVar11 = *piVar7;
      if (iVar11 == -1) {
        *piVar7 = p_00->nSize;
        Vec_WrdPush(p_00,uVar15 | 0xffffffff00000000);
      }
      else if ((iVar11 < 0) || (p_00->nSize <= iVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar14);
  }
  if (p_00->nSize != uVar14) {
    __assert_fail("Vec_WrdSize(p->vObjs) == nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x18a,"Hsh_IntMan_t *Hsh_WrdManHashArrayStart(Vec_Wrd_t *, int)");
  }
  if (pvConfgRes == (Vec_Int_t **)0x0) {
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (int *)0x0;
    }
    free(__ptr_00);
  }
  else {
    *pvConfgRes = __ptr_00;
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return p;
}

Assistant:

Hsh_IntMan_t * Sdm_ManBuildHashTable( Vec_Int_t ** pvConfgRes ) 
{
    FILE * pFile;
    char * pFileName = "dsdfuncs6.dat";
    int RetValue, size = Extra_FileSize( pFileName ) / 12;  // 2866420
    Vec_Wrd_t * vTruthRes = Vec_WrdAlloc( size );
    Vec_Int_t * vConfgRes = Vec_IntAlloc( size );
    Hsh_IntMan_t * pHash;

    pFile = fopen( pFileName, "rb" );
    RetValue = fread( Vec_WrdArray(vTruthRes), sizeof(word), size, pFile );
    RetValue = fread( Vec_IntArray(vConfgRes), sizeof(int), size, pFile );
    vTruthRes->nSize = size;
    vConfgRes->nSize = size;
    // create hash table
    pHash = Hsh_WrdManHashArrayStart( vTruthRes, 1 );
    // cleanup
    if ( pvConfgRes )
        *pvConfgRes = vConfgRes;
    else
        Vec_IntFree( vConfgRes );
    Vec_WrdFree( vTruthRes );
//    Hsh_IntManStop( pHash );
    return pHash;
}